

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this,void **vtt)

{
  undefined8 *in_RSI;
  TPZStructMatrixT<double> *in_RDI;
  void **vtt_00;
  TPZStructMatrixOR<double> *this_00;
  void **in_stack_ffffffffffffffc8;
  
  vtt_00 = (void **)0x0;
  this_00 = (TPZStructMatrixOR<double> *)0x0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fDestIndices.fNElements = 0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fDestIndices.fNAlloc = 0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fDestIndices._vptr_TPZVec = (_func_int **)0x0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fDestIndices.fStore = (long *)0x0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fActiveEqs.fNElements = 0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fActiveEqs.fNAlloc = 0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fActiveEqs._vptr_TPZVec = (_func_int **)0x0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fActiveEqs.fStore = (long *)0x0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.fNumEq = 0;
  *(undefined8 *)&(in_RDI->super_TPZStructMatrix).fEquationFilter.fIsActive = 0;
  (in_RDI->super_TPZStructMatrix).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->super_TPZStructMatrix).fEquationFilter.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  (in_RDI->super_TPZStructMatrix).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = (_Base_ptr)0x0;
  (in_RDI->super_TPZStructMatrix).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = (_Base_ptr)0x0;
  *(undefined8 *)
   &(in_RDI->super_TPZStructMatrix).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->super_TPZStructMatrix).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (in_RDI->super_TPZStructMatrix).fCompMesh.fRef = (TPZReference *)0x0;
  *(undefined8 *)&(in_RDI->super_TPZStructMatrix).fMaterialIds._M_t._M_impl = 0;
  *(undefined8 *)&in_RDI->super_TPZStructMatrix = 0;
  (in_RDI->super_TPZStructMatrix).fMesh = (TPZCompMesh *)0x0;
  TPZStructMatrixT<double>::TPZStructMatrixT(in_RDI,in_stack_ffffffffffffffc8);
  TPZStructMatrixOR<double>::TPZStructMatrixOR(this_00,vtt_00);
  *(undefined8 *)&in_RDI->super_TPZStructMatrix = *in_RSI;
  *(undefined8 *)
   (&(in_RDI->super_TPZStructMatrix).field_0x0 +
   *(long *)(*(long *)&in_RDI->super_TPZStructMatrix + -0x60)) = in_RSI[10];
  *(undefined8 *)
   (&(in_RDI->super_TPZStructMatrix).field_0x0 +
   *(long *)(*(long *)&in_RDI->super_TPZStructMatrix + -0x68)) = in_RSI[0xb];
  *(undefined8 *)&(in_RDI->super_TPZStructMatrix).field_0xa0 = in_RSI[0xc];
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}